

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::Type> __thiscall
mocker::Parser::type(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  TokIter TVar1;
  TokIter TVar2;
  TokenID TVar3;
  Token *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Token *pTVar5;
  shared_ptr<mocker::ast::NonarrayType> sVar6;
  shared_ptr<mocker::ast::ArrayType> sVar7;
  shared_ptr<mocker::ast::Type> sVar8;
  Position beg;
  Position end_00;
  Token *pTStack_a0;
  Parser local_88;
  Parser local_70 [2];
  size_t local_40;
  shared_ptr<mocker::ast::Type> *local_38;
  
  this_00 = *end._M_current;
  sVar6 = nonarrayType(local_70,iter,end);
  _Var4 = sVar6.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  pTStack_a0 = local_70[0].tokEnd._M_current;
  if (local_70[0].tokBeg._M_current == (Token *)0x0) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
LAB_0017b13e:
    if (pTStack_a0 != (Token *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTStack_a0);
      _Var4._M_pi = extraout_RDX_03;
    }
  }
  else {
    pTVar5 = *end._M_current;
    TVar1._M_current = local_70[0].tokBeg._M_current;
    pTStack_a0 = local_70[0].tokEnd._M_current;
    while ((pTVar5 != in_RCX &&
           (TVar3 = Token::tokenID(pTVar5), _Var4._M_pi = extraout_RDX, TVar3 == LeftBracket))) {
      pTVar5 = (Token *)(*(long *)end._M_current + 0x38);
      *(Token **)end._M_current = pTVar5;
      if ((pTVar5 == in_RCX) ||
         (TVar3 = Token::tokenID(pTVar5), _Var4._M_pi = extraout_RDX_00, TVar3 != RightBracket)) {
        *(Token **)end._M_current = this_00;
        (this->tokBeg)._M_current = (Token *)0x0;
        (this->tokEnd)._M_current = (Token *)0x0;
        goto LAB_0017b13e;
      }
      Token::position(this_00);
      TVar2._M_current = local_70[0].tokEnd._M_current;
      TVar1._M_current = local_70[0].tokBeg._M_current;
      Token::position(*end._M_current);
      beg.col = (size_t)TVar1._M_current;
      beg.line = (size_t)iter;
      end_00.col = local_40;
      end_00.line = (size_t)TVar2._M_current;
      sVar7 = makeNode<mocker::ast::ArrayType,std::shared_ptr<mocker::ast::Type>&>
                        (&local_88,beg,end_00,local_38);
      TVar2._M_current = local_88.tokEnd._M_current;
      TVar1._M_current = local_88.tokBeg._M_current;
      _Var4 = sVar7.super___shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      local_88.tokBeg._M_current = (Token *)0x0;
      local_88.tokEnd._M_current = (Token *)0x0;
      if ((pTStack_a0 != (Token *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTStack_a0),
         _Var4._M_pi = extraout_RDX_01, local_88.tokEnd._M_current != (Token *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.tokEnd._M_current);
        _Var4._M_pi = extraout_RDX_02;
      }
      pTVar5 = (Token *)(*(long *)end._M_current + 0x38);
      *(Token **)end._M_current = pTVar5;
      pTStack_a0 = TVar2._M_current;
    }
    (this->tokBeg)._M_current = TVar1._M_current;
    (this->tokEnd)._M_current = pTStack_a0;
  }
  sVar8.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar8.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Type>)
         sVar8.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Type> Parser::type(TokIter &iter, TokIter end) {
  auto beg = iter;
  std::shared_ptr<ast::Type> res = nonarrayType(iter, end);
  if (!res)
    return nullptr;

  auto id = GetTokenID(end);
  while (id(iter) == TokenID::LeftBracket) {
    ++iter;
    if (id(iter) != TokenID::RightBracket) {
      iter = beg;
      return nullptr;
    }
    res = makeNode<ast::ArrayType>(beg->position().first,
                                   iter->position().second, res);
    ++iter;
  }
  return res;
}